

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdrivr.c
# Opt level: O2

FT_Error cff_get_ros(CFF_Face face,char **registry,char **ordering,FT_Int *supplement)

{
  FT_UInt sid;
  CFF_Font_conflict font;
  FT_String *pFVar1;
  FT_Error FVar2;
  
  font = (CFF_Font_conflict)(face->extra).data;
  FVar2 = 0;
  if (font != (CFF_Font_conflict)0x0) {
    sid = (font->top_font).font_dict.cid_registry;
    if (sid == 0xffff) {
      FVar2 = 6;
    }
    else {
      if (registry != (char **)0x0) {
        pFVar1 = font->registry;
        if (pFVar1 == (FT_String *)0x0) {
          pFVar1 = cff_index_get_sid_string(font,sid);
          font->registry = pFVar1;
        }
        *registry = pFVar1;
      }
      if (ordering != (char **)0x0) {
        pFVar1 = font->ordering;
        if (pFVar1 == (FT_String *)0x0) {
          pFVar1 = cff_index_get_sid_string(font,(font->top_font).font_dict.cid_ordering);
          font->ordering = pFVar1;
        }
        *ordering = pFVar1;
      }
      FVar2 = 0;
      if (supplement != (FT_Int *)0x0) {
        *supplement = (FT_Int)(font->top_font).font_dict.cid_supplement;
      }
    }
  }
  return FVar2;
}

Assistant:

static FT_Error
  cff_get_ros( CFF_Face      face,
               const char*  *registry,
               const char*  *ordering,
               FT_Int       *supplement )
  {
    FT_Error  error = FT_Err_Ok;
    CFF_Font  cff   = (CFF_Font)face->extra.data;


    if ( cff )
    {
      CFF_FontRecDict  dict = &cff->top_font.font_dict;


      if ( dict->cid_registry == 0xFFFFU )
      {
        error = FT_THROW( Invalid_Argument );
        goto Fail;
      }

      if ( registry )
      {
        if ( !cff->registry )
          cff->registry = cff_index_get_sid_string( cff,
                                                    dict->cid_registry );
        *registry = cff->registry;
      }

      if ( ordering )
      {
        if ( !cff->ordering )
          cff->ordering = cff_index_get_sid_string( cff,
                                                    dict->cid_ordering );
        *ordering = cff->ordering;
      }

      /*
       * XXX: According to Adobe TechNote #5176, the supplement in CFF
       *      can be a real number. We truncate it to fit public API
       *      since freetype-2.3.6.
       */
      if ( supplement )
      {
        if ( dict->cid_supplement < FT_INT_MIN ||
             dict->cid_supplement > FT_INT_MAX )
          FT_TRACE1(( "cff_get_ros: too large supplement %d is truncated\n",
                      dict->cid_supplement ));
        *supplement = (FT_Int)dict->cid_supplement;
      }
    }

  Fail:
    return error;
  }